

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  ConstMemberIterator CVar6;
  Number NVar7;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *pGVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar9;
  uint index;
  undefined8 uVar10;
  Pointer pVVar11;
  double dVar12;
  Data local_40;
  
  uVar1 = *(ushort *)(this + 0xe);
  uVar2 = (rhs->data_).f.flags;
  if ((uVar1 & 7) == (uVar2 & 7)) {
    switch(uVar1 & 7) {
    case 3:
      if (*(SizeType *)this == (rhs->data_).s.length) {
        if (uVar1 != 3) {
          __assert_fail("IsObject()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                        ,0x4f4,
                        "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                       );
        }
        uVar3 = *(ulong *)(this + 8);
        CVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
        bVar4 = CVar6.ptr_ == (Pointer)(uVar3 & 0xffffffffffff);
        if (bVar4) {
          return bVar4;
        }
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember<rapidjson::CrtAllocator>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_40.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)rhs);
        uVar10 = local_40.n;
        NVar7.i = (I)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(rhs);
        if (uVar10 == NVar7.i64) {
          return bVar4;
        }
        pVVar11 = (Pointer)(uVar3 & 0xffffffffffff);
        while( true ) {
          bVar5 = operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                             &pVVar11->value,
                             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)(uVar10 + 0x10));
          if (!bVar5) {
            return bVar4;
          }
          CVar6 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
          bVar4 = pVVar11 + 1 == CVar6.ptr_;
          if (bVar4) break;
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember<rapidjson::CrtAllocator>
                    ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_40.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)rhs);
          uVar10 = local_40.n;
          NVar7.i = (I)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::MemberEnd(rhs);
          pVVar11 = pVVar11 + 1;
          if (uVar10 == NVar7.i64) {
            return bVar4;
          }
        }
        return bVar4;
      }
      break;
    case 4:
      if (*(SizeType *)this == (rhs->data_).s.length) {
        bVar4 = *(int *)this == 0;
        if (bVar4) {
          return bVar4;
        }
        pGVar8 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator[]
                           ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,0);
        pGVar9 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](rhs,0);
        bVar5 = operator==(pGVar8,pGVar9);
        if (!bVar5) {
          return bVar4;
        }
        index = 1;
        do {
          bVar4 = *(uint *)this <= index;
          if (bVar4) {
            return bVar4;
          }
          pGVar8 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator[]
                             ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                              index);
          pGVar9 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](rhs,index);
          bVar5 = operator==(pGVar8,pGVar9);
          index = index + 1;
        } while (bVar5);
        return bVar4;
      }
      break;
    case 5:
      bVar4 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(this,rhs);
      return bVar4;
    case 6:
      if (((uVar2 | uVar1) >> 9 & 1) == 0) {
        return *(long *)this == (rhs->data_).n.i64;
      }
      local_40.s.str =
           (Ch *)GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble
                           ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
      dVar12 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetDouble(rhs);
      return dVar12 == (double)local_40.s.str;
    default:
      return true;
    }
  }
  return false;
}

Assistant:

bool operator==(const GenericValue<Encoding, SourceAllocator>& rhs) const {
        typedef GenericValue<Encoding, SourceAllocator> RhsType;
        if (GetType() != rhs.GetType())
            return false;

        switch (GetType()) {
        case kObjectType: // Warning: O(n^2) inner-loop
            if (data_.o.size != rhs.data_.o.size)
                return false;           
            for (ConstMemberIterator lhsMemberItr = MemberBegin(); lhsMemberItr != MemberEnd(); ++lhsMemberItr) {
                typename RhsType::ConstMemberIterator rhsMemberItr = rhs.FindMember(lhsMemberItr->name);
                if (rhsMemberItr == rhs.MemberEnd() || (!(lhsMemberItr->value == rhsMemberItr->value)))
                    return false;
            }
            return true;
            
        case kArrayType:
            if (data_.a.size != rhs.data_.a.size)
                return false;
            for (SizeType i = 0; i < data_.a.size; i++)
                if (!((*this)[i] == rhs[i]))
                    return false;
            return true;

        case kStringType:
            return StringEqual(rhs);

        case kNumberType:
            if (IsDouble() || rhs.IsDouble()) {
                double a = GetDouble();     // May convert from integer to double.
                double b = rhs.GetDouble(); // Ditto
                return a >= b && a <= b;    // Prevent -Wfloat-equal
            }
            else
                return data_.n.u64 == rhs.data_.n.u64;

        default:
            return true;
        }
    }